

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::interpretR3EncryptionParameters
          (QPDFWriter *this,set<int,_std::less<int>,_std::allocator<int>_> *clear,
          char *user_password,char *owner_password,bool allow_accessibility,bool allow_extract,
          bool allow_assemble,bool allow_annotate_and_form,bool allow_form_filling,
          bool allow_modify_other,qpdf_r3_print_e print,qpdf_r3_modify_e modify)

{
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar1;
  value_type_conflict3 local_144;
  _Base_ptr local_140;
  undefined1 local_138;
  value_type_conflict3 local_12c;
  _Base_ptr local_128;
  undefined1 local_120;
  value_type_conflict3 local_114;
  _Base_ptr local_110;
  undefined1 local_108;
  value_type_conflict3 local_fc;
  _Base_ptr local_f8;
  undefined1 local_f0;
  value_type_conflict3 local_e4;
  _Base_ptr local_e0;
  undefined1 local_d8;
  value_type_conflict3 local_cc;
  _Base_ptr local_c8;
  undefined1 local_c0;
  value_type_conflict3 local_b4;
  _Base_ptr local_b0;
  undefined1 local_a8;
  value_type_conflict3 local_9c;
  _Base_ptr local_98;
  undefined1 local_90;
  value_type_conflict3 local_84;
  _Base_ptr local_80;
  undefined1 local_78;
  value_type_conflict3 local_6c;
  _Base_ptr local_68;
  undefined1 local_60;
  value_type_conflict3 local_54;
  _Base_ptr local_50;
  undefined1 local_48;
  value_type_conflict3 local_3c;
  byte local_36;
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  undefined1 local_31;
  bool allow_modify_other_local;
  bool allow_form_filling_local;
  bool allow_annotate_and_form_local;
  bool allow_assemble_local;
  bool allow_extract_local;
  char *pcStack_30;
  bool allow_accessibility_local;
  char *owner_password_local;
  char *user_password_local;
  set<int,_std::less<int>,_std::allocator<int>_> *clear_local;
  QPDFWriter *this_local;
  
  local_33 = allow_assemble;
  local_34 = allow_annotate_and_form;
  local_35 = allow_form_filling;
  local_36 = allow_modify_other;
  local_32 = allow_extract;
  local_31 = allow_accessibility;
  pcStack_30 = owner_password;
  owner_password_local = user_password;
  user_password_local = (char *)clear;
  clear_local = (set<int,_std::less<int>,_std::allocator<int>_> *)this;
  if (!allow_accessibility) {
    local_3c = 10;
    pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(clear,&local_3c);
    local_50 = (_Base_ptr)pVar1.first._M_node;
    local_48 = pVar1.second;
  }
  if ((local_32 & 1) == 0) {
    local_54 = 5;
    pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)user_password_local,
                       &local_54);
    local_68 = (_Base_ptr)pVar1.first._M_node;
    local_60 = pVar1.second;
  }
  if (print != qpdf_r3p_full) {
    if (print != qpdf_r3p_low) {
      if (print != qpdf_r3p_none) goto LAB_0030db63;
      local_6c = 3;
      pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)user_password_local,
                         &local_6c);
      local_80 = (_Base_ptr)pVar1.first._M_node;
      local_78 = pVar1.second;
    }
    local_84 = 0xc;
    pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)user_password_local,
                       &local_84);
    local_98 = (_Base_ptr)pVar1.first._M_node;
    local_90 = pVar1.second;
  }
LAB_0030db63:
  switch(modify) {
  case qpdf_r3m_none:
    local_9c = 0xb;
    pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)user_password_local,
                       &local_9c);
    local_b0 = (_Base_ptr)pVar1.first._M_node;
    local_a8 = pVar1.second;
  case qpdf_r3m_assembly:
    local_b4 = 9;
    pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)user_password_local,
                       &local_b4);
    local_c8 = (_Base_ptr)pVar1.first._M_node;
    local_c0 = pVar1.second;
  case qpdf_r3m_form:
    local_cc = 6;
    pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)user_password_local,
                       &local_cc);
    local_e0 = (_Base_ptr)pVar1.first._M_node;
    local_d8 = pVar1.second;
  case qpdf_r3m_annotate:
    local_e4 = 4;
    pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)user_password_local,
                       &local_e4);
    local_f8 = (_Base_ptr)pVar1.first._M_node;
    local_f0 = pVar1.second;
  case qpdf_r3m_all:
  default:
    if ((local_33 & 1) == 0) {
      local_fc = 0xb;
      pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)user_password_local,
                         &local_fc);
      local_110 = (_Base_ptr)pVar1.first._M_node;
      local_108 = pVar1.second;
    }
    if ((local_34 & 1) == 0) {
      local_114 = 6;
      pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)user_password_local,
                         &local_114);
      local_128 = (_Base_ptr)pVar1.first._M_node;
      local_120 = pVar1.second;
    }
    if ((local_35 & 1) == 0) {
      local_12c = 9;
      pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)user_password_local,
                         &local_12c);
      local_140 = (_Base_ptr)pVar1.first._M_node;
      local_138 = pVar1.second;
    }
    if ((local_36 & 1) == 0) {
      local_144 = 4;
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)user_password_local,&local_144);
    }
    return;
  }
}

Assistant:

void
QPDFWriter::interpretR3EncryptionParameters(
    std::set<int>& clear,
    char const* user_password,
    char const* owner_password,
    bool allow_accessibility,
    bool allow_extract,
    bool allow_assemble,
    bool allow_annotate_and_form,
    bool allow_form_filling,
    bool allow_modify_other,
    qpdf_r3_print_e print,
    qpdf_r3_modify_e modify)
{
    // Acrobat 5 security options:

    // Checkboxes:
    //   Enable Content Access for the Visually Impaired
    //   Allow Content Copying and Extraction

    // Allowed changes menu:
    //   None
    //   Only Document Assembly
    //   Only Form Field Fill-in or Signing
    //   Comment Authoring, Form Field Fill-in or Signing
    //   General Editing, Comment and Form Field Authoring

    // Allowed printing menu:
    //   None
    //   Low Resolution
    //   Full printing

    // Meanings of bits in P when R >= 3
    //
    //  3: low-resolution printing
    //  4: document modification except as controlled by 6, 9, and 11
    //  5: extraction
    //  6: add/modify annotations (comment), fill in forms
    //     if 4+6 are set, also allows modification of form fields
    //  9: fill in forms even if 6 is clear
    // 10: accessibility; ignored by readers, should always be set
    // 11: document assembly even if 4 is clear
    // 12: high-resolution printing

    if (!allow_accessibility) {
        // setEncryptionParameters sets this if R > 3
        clear.insert(10);
    }
    if (!allow_extract) {
        clear.insert(5);
    }

    // Note: these switch statements all "fall through" (no break statements).  Each option clears
    // successively more access bits.
    switch (print) {
    case qpdf_r3p_none:
        clear.insert(3); // any printing

    case qpdf_r3p_low:
        clear.insert(12); // high resolution printing

    case qpdf_r3p_full:
        break;

        // no default so gcc warns for missing cases
    }

    // Modify options. The qpdf_r3_modify_e options control groups of bits and lack the full
    // flexibility of the spec. This is unfortunate, but it's been in the API for ages, and we're
    // stuck with it. See also allow checks below to control the bits individually.

    // NOT EXERCISED IN TEST SUITE
    switch (modify) {
    case qpdf_r3m_none:
        clear.insert(11); // document assembly

    case qpdf_r3m_assembly:
        clear.insert(9); // filling in form fields

    case qpdf_r3m_form:
        clear.insert(6); // modify annotations, fill in form fields

    case qpdf_r3m_annotate:
        clear.insert(4); // other modifications

    case qpdf_r3m_all:
        break;

        // no default so gcc warns for missing cases
    }
    // END NOT EXERCISED IN TEST SUITE

    if (!allow_assemble) {
        clear.insert(11);
    }
    if (!allow_annotate_and_form) {
        clear.insert(6);
    }
    if (!allow_form_filling) {
        clear.insert(9);
    }
    if (!allow_modify_other) {
        clear.insert(4);
    }
}